

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caniter.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::CanonicalIterator::getEquivalents
          (CanonicalIterator *this,UnicodeString *segment,int32_t *result_len,UErrorCode *status)

{
  int iVar1;
  undefined1 auVar2 [16];
  UBool UVar3;
  int32_t iVar4;
  UnicodeString *pUVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  char16_t *pos;
  UMemory *this_00;
  CanonicalIterator *local_528;
  CanonicalIterator *local_500;
  UnicodeString *local_4d8;
  int32_t resultCount;
  UnicodeString *finalResult;
  undefined1 local_448 [8];
  UnicodeString attempt;
  UnicodeString possible;
  UHashElement *pUStack_3c0;
  int32_t el2;
  UHashElement *ne2;
  UnicodeString item;
  UHashElement *pUStack_370;
  int32_t el;
  UHashElement *ne;
  int32_t local_35c;
  char16_t local_358 [2];
  int32_t segLen;
  UChar USeg [256];
  undefined1 local_148 [8];
  Hashtable basic;
  undefined1 local_e0 [8];
  Hashtable permutations;
  Hashtable result;
  UErrorCode *status_local;
  int32_t *result_len_local;
  UnicodeString *segment_local;
  CanonicalIterator *this_local;
  
  Hashtable::Hashtable((Hashtable *)&permutations.hashObj.primeIndex,status);
  Hashtable::Hashtable((Hashtable *)local_e0,status);
  Hashtable::Hashtable((Hashtable *)local_148,status);
  UVar3 = ::U_FAILURE(*status);
  if (UVar3 == '\0') {
    Hashtable::setValueDeleter((Hashtable *)&permutations.hashObj.primeIndex,uprv_deleteUObject_63);
    Hashtable::setValueDeleter((Hashtable *)local_e0,uprv_deleteUObject_63);
    Hashtable::setValueDeleter((Hashtable *)local_148,uprv_deleteUObject_63);
    Char16Ptr::Char16Ptr((Char16Ptr *)&ne,local_358);
    iVar4 = UnicodeString::extract(segment,(Char16Ptr *)&ne,0x100,status);
    Char16Ptr::~Char16Ptr((Char16Ptr *)&ne);
    local_35c = iVar4;
    getEquivalents2(this,(Hashtable *)local_148,local_358,iVar4,status);
    item.fUnion._52_4_ = 0xffffffff;
    pos = item.fUnion.fStackFields.fBuffer + 0x19;
    pUStack_370 = Hashtable::nextElement((Hashtable *)local_148,(int32_t *)pos);
    while (pUStack_370 != (UHashElement *)0x0) {
      UnicodeString::UnicodeString
                ((UnicodeString *)&ne2,(UnicodeString *)(pUStack_370->value).pointer);
      Hashtable::removeAll((Hashtable *)local_e0);
      permute((UnicodeString *)&ne2,'\x01',(Hashtable *)local_e0,status);
      possible.fUnion._52_4_ = 0xffffffff;
      pUStack_3c0 = Hashtable::nextElement
                              ((Hashtable *)local_e0,
                               (int32_t *)(possible.fUnion.fStackFields.fBuffer + 0x19));
      while (pUStack_3c0 != (UHashElement *)0x0) {
        UnicodeString::UnicodeString
                  ((UnicodeString *)((long)&attempt.fUnion + 0x30),
                   (UnicodeString *)(pUStack_3c0->value).pointer);
        UnicodeString::UnicodeString((UnicodeString *)local_448);
        (*(this->nfd->super_UObject)._vptr_UObject[3])
                  (this->nfd,(undefined1 *)((long)&attempt.fUnion + 0x30),local_448,status);
        pUVar5 = segment;
        UVar3 = UnicodeString::operator==((UnicodeString *)local_448,segment);
        if (UVar3 != '\0') {
          pUVar5 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pUVar5);
          local_4d8 = (UnicodeString *)0x0;
          if (pUVar5 != (UnicodeString *)0x0) {
            UnicodeString::UnicodeString(pUVar5,(UnicodeString *)((long)&attempt.fUnion + 0x30));
            local_4d8 = pUVar5;
          }
          Hashtable::put((Hashtable *)&permutations.hashObj.primeIndex,
                         (UnicodeString *)((long)&attempt.fUnion + 0x30),local_4d8,status);
        }
        pUStack_3c0 = Hashtable::nextElement
                                ((Hashtable *)local_e0,
                                 (int32_t *)(possible.fUnion.fStackFields.fBuffer + 0x19));
        UnicodeString::~UnicodeString((UnicodeString *)local_448);
        UnicodeString::~UnicodeString((UnicodeString *)((long)&attempt.fUnion + 0x30));
      }
      pos = item.fUnion.fStackFields.fBuffer + 0x19;
      pUStack_370 = Hashtable::nextElement((Hashtable *)local_148,(int32_t *)pos);
      UnicodeString::~UnicodeString((UnicodeString *)&ne2);
    }
    UVar3 = ::U_FAILURE(*status);
    if (UVar3 == '\0') {
      iVar4 = Hashtable::count((Hashtable *)&permutations.hashObj.primeIndex);
      if (iVar4 == 0) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        this_local = (CanonicalIterator *)0x0;
      }
      else {
        uVar6 = (ulong)iVar4;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar6;
        uVar7 = SUB168(auVar2 * ZEXT816(0x40),0);
        this_00 = (UMemory *)(uVar7 + 8);
        if (SUB168(auVar2 * ZEXT816(0x40),8) != 0 || 0xfffffffffffffff7 < uVar7) {
          this_00 = (UMemory *)0xffffffffffffffff;
        }
        puVar8 = (ulong *)UMemory::operator_new__(this_00,(size_t)pos);
        local_500 = (CanonicalIterator *)0x0;
        if (puVar8 != (ulong *)0x0) {
          *puVar8 = uVar6;
          local_500 = (CanonicalIterator *)(puVar8 + 1);
          if (uVar6 != 0) {
            local_528 = local_500;
            do {
              UnicodeString::UnicodeString((UnicodeString *)local_528);
              local_528 = (CanonicalIterator *)((StackBufferOrFields *)&local_528->source + 1);
            } while (local_528 != (CanonicalIterator *)(&local_500->super_UObject + uVar6 * 8));
          }
        }
        if (local_500 == (CanonicalIterator *)0x0) {
          *status = U_MEMORY_ALLOCATION_ERROR;
          this_local = (CanonicalIterator *)0x0;
        }
        else {
          *result_len = 0;
          item.fUnion._52_4_ = 0xffffffff;
          pUStack_370 = Hashtable::nextElement
                                  ((Hashtable *)&permutations.hashObj.primeIndex,
                                   (int32_t *)(item.fUnion.fStackFields.fBuffer + 0x19));
          while (pUStack_370 != (UHashElement *)0x0) {
            pUVar5 = (UnicodeString *)(pUStack_370->value).pointer;
            iVar1 = *result_len;
            *result_len = iVar1 + 1;
            UnicodeString::operator=
                      ((UnicodeString *)(&local_500->super_UObject + (long)iVar1 * 8),pUVar5);
            pUStack_370 = Hashtable::nextElement
                                    ((Hashtable *)&permutations.hashObj.primeIndex,
                                     (int32_t *)(item.fUnion.fStackFields.fBuffer + 0x19));
          }
          this_local = local_500;
        }
      }
    }
    else {
      this_local = (CanonicalIterator *)0x0;
    }
  }
  else {
    this_local = (CanonicalIterator *)0x0;
  }
  Hashtable::~Hashtable((Hashtable *)local_148);
  Hashtable::~Hashtable((Hashtable *)local_e0);
  Hashtable::~Hashtable((Hashtable *)&permutations.hashObj.primeIndex);
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString* CanonicalIterator::getEquivalents(const UnicodeString &segment, int32_t &result_len, UErrorCode &status) {
    Hashtable result(status);
    Hashtable permutations(status);
    Hashtable basic(status);
    if (U_FAILURE(status)) {
        return 0;
    }
    result.setValueDeleter(uprv_deleteUObject);
    permutations.setValueDeleter(uprv_deleteUObject);
    basic.setValueDeleter(uprv_deleteUObject);

    UChar USeg[256];
    int32_t segLen = segment.extract(USeg, 256, status);
    getEquivalents2(&basic, USeg, segLen, status);

    // now get all the permutations
    // add only the ones that are canonically equivalent
    // TODO: optimize by not permuting any class zero.

    const UHashElement *ne = NULL;
    int32_t el = UHASH_FIRST;
    //Iterator it = basic.iterator();
    ne = basic.nextElement(el);
    //while (it.hasNext())
    while (ne != NULL) {
        //String item = (String) it.next();
        UnicodeString item = *((UnicodeString *)(ne->value.pointer));

        permutations.removeAll();
        permute(item, CANITER_SKIP_ZEROES, &permutations, status);
        const UHashElement *ne2 = NULL;
        int32_t el2 = UHASH_FIRST;
        //Iterator it2 = permutations.iterator();
        ne2 = permutations.nextElement(el2);
        //while (it2.hasNext())
        while (ne2 != NULL) {
            //String possible = (String) it2.next();
            //UnicodeString *possible = new UnicodeString(*((UnicodeString *)(ne2->value.pointer)));
            UnicodeString possible(*((UnicodeString *)(ne2->value.pointer)));
            UnicodeString attempt;
            nfd.normalize(possible, attempt, status);

            // TODO: check if operator == is semanticaly the same as attempt.equals(segment)
            if (attempt==segment) {
                //if (PROGRESS) printf("Adding Permutation: %s\n", UToS(Tr(*possible)));
                // TODO: use the hashtable just to catch duplicates - store strings directly (somehow).
                result.put(possible, new UnicodeString(possible), status); //add(possible);
            } else {
                //if (PROGRESS) printf("-Skipping Permutation: %s\n", UToS(Tr(*possible)));
            }

            ne2 = permutations.nextElement(el2);
        }
        ne = basic.nextElement(el);
    }

    /* Test for buffer overflows */
    if(U_FAILURE(status)) {
        return 0;
    }
    // convert into a String[] to clean up storage
    //String[] finalResult = new String[result.size()];
    UnicodeString *finalResult = NULL;
    int32_t resultCount;
    if((resultCount = result.count()) != 0) {
        finalResult = new UnicodeString[resultCount];
        if (finalResult == 0) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return NULL;
        }
    }
    else {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }
    //result.toArray(finalResult);
    result_len = 0;
    el = UHASH_FIRST;
    ne = result.nextElement(el);
    while(ne != NULL) {
        finalResult[result_len++] = *((UnicodeString *)(ne->value.pointer));
        ne = result.nextElement(el);
    }


    return finalResult;
}